

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O3

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::anon_unknown_0::AsyncifyLocals::create(AsyncifyLocals *this)

{
  _func_int *p_Var1;
  _func_int *p_Var2;
  _func_int **pp_Var3;
  long in_RSI;
  
  p_Var1 = *(_func_int **)(in_RSI + 0x130);
  p_Var2 = *(_func_int **)(in_RSI + 0x148);
  pp_Var3 = (_func_int **)operator_new(0x1c8);
  pp_Var3[1] = (_func_int *)0x0;
  pp_Var3[2] = (_func_int *)(pp_Var3 + 4);
  pp_Var3[3] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var3 + 4) = 0;
  *(undefined1 *)(pp_Var3 + 10) = 0;
  pp_Var3[0xb] = (_func_int *)0x0;
  pp_Var3[0xc] = (_func_int *)0x0;
  pp_Var3[0x21] = (_func_int *)0x0;
  pp_Var3[0x22] = (_func_int *)0x0;
  pp_Var3[0x23] = (_func_int *)0x0;
  pp_Var3[0x24] = (_func_int *)0x0;
  pp_Var3[0x25] = (_func_int *)0x0;
  *pp_Var3 = (_func_int *)&PTR__AsyncifyLocals_01071908;
  pp_Var3[0x26] = p_Var1;
  p_Var1 = *(_func_int **)(in_RSI + 0x140);
  pp_Var3[0x27] = *(_func_int **)(in_RSI + 0x138);
  pp_Var3[0x28] = p_Var1;
  pp_Var3[0x29] = p_Var2;
  pp_Var3[0x2a] = (_func_int *)0x0;
  pp_Var3[0x2c] = (_func_int *)(pp_Var3 + 0x32);
  pp_Var3[0x2d] = (_func_int *)0x1;
  pp_Var3[0x2e] = (_func_int *)0x0;
  pp_Var3[0x2f] = (_func_int *)0x0;
  *(undefined4 *)(pp_Var3 + 0x30) = 0x3f800000;
  pp_Var3[0x31] = (_func_int *)0x0;
  pp_Var3[0x32] = (_func_int *)0x0;
  *(undefined4 *)(pp_Var3 + 0x34) = 0;
  pp_Var3[0x35] = (_func_int *)0x0;
  pp_Var3[0x36] = (_func_int *)(pp_Var3 + 0x34);
  pp_Var3[0x37] = (_func_int *)(pp_Var3 + 0x34);
  pp_Var3[0x38] = (_func_int *)0x0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>_>
  ).super_Pass._vptr_Pass = pp_Var3;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<AsyncifyLocals>(
      analyzer, pointerType, asyncifyMemory);
  }